

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToUVJRow_C(uint8_t *src_rgb0,int src_stride_rgb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  int in_ESI;
  byte *in_RDI;
  uint in_R8D;
  uint8_t ar_1;
  uint8_t ag_1;
  uint8_t ab_1;
  uint8_t ar;
  uint8_t ag;
  uint8_t ab;
  int x;
  uint8_t *src_rgb1;
  int local_34;
  byte *local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  byte *local_8;
  
  local_30 = in_RDI + in_ESI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < (int)(in_R8D - 1); local_34 = local_34 + 2) {
    uVar1 = (uint8_t)(((int)((uint)local_8[2] + (uint)local_30[2] + 1) >> 1) +
                      ((int)((uint)local_8[5] + (uint)local_30[5] + 1) >> 1) + 1 >> 1);
    uVar2 = (uint8_t)(((int)((uint)local_8[1] + (uint)local_30[1] + 1) >> 1) +
                      ((int)((uint)local_8[4] + (uint)local_30[4] + 1) >> 1) + 1 >> 1);
    uVar3 = (uint8_t)(((int)((uint)*local_8 + (uint)*local_30 + 1) >> 1) +
                      ((int)((uint)local_8[3] + (uint)local_30[3] + 1) >> 1) + 1 >> 1);
    iVar4 = libyuv::RGBToUJ(uVar3,uVar2,uVar1);
    *local_18 = (char)iVar4;
    iVar4 = libyuv::RGBToVJ(uVar3,uVar2,uVar1);
    *local_20 = (char)iVar4;
    local_8 = local_8 + 6;
    local_30 = local_30 + 6;
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
  }
  if ((in_R8D & 1) != 0) {
    uVar1 = (uint8_t)((int)((uint)local_8[2] + (uint)local_30[2] + 1) >> 1);
    uVar2 = (uint8_t)((int)((uint)local_8[1] + (uint)local_30[1] + 1) >> 1);
    uVar3 = (uint8_t)((int)((uint)*local_8 + (uint)*local_30 + 1) >> 1);
    iVar4 = libyuv::RGBToUJ(uVar3,uVar2,uVar1);
    *local_18 = (char)iVar4;
    iVar4 = libyuv::RGBToVJ(uVar3,uVar2,uVar1);
    *local_20 = (char)iVar4;
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}